

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void cellUnion(Rtree *pRtree,RtreeCell *p1,RtreeCell *p2)

{
  RtreeCoord local_34;
  RtreeCoord local_30;
  RtreeCoord local_2c;
  RtreeCoord local_28;
  int local_24;
  int ii;
  RtreeCell *p2_local;
  RtreeCell *p1_local;
  Rtree *pRtree_local;
  
  local_24 = 0;
  if (pRtree->eCoordType == '\0') {
    do {
      if (p2->aCoord[local_24].f <= p1->aCoord[local_24].f) {
        local_28 = p2->aCoord[local_24];
      }
      else {
        local_28 = p1->aCoord[local_24];
      }
      p1->aCoord[local_24] = local_28;
      if (p1->aCoord[local_24 + 1].f < p2->aCoord[local_24 + 1].f ||
          p1->aCoord[local_24 + 1].f == p2->aCoord[local_24 + 1].f) {
        local_2c = p2->aCoord[local_24 + 1];
      }
      else {
        local_2c = p1->aCoord[local_24 + 1];
      }
      p1->aCoord[local_24 + 1] = local_2c;
      local_24 = local_24 + 2;
    } while (local_24 < (int)(uint)pRtree->nDim2);
  }
  else {
    do {
      if (p1->aCoord[local_24].i < p2->aCoord[local_24].i) {
        local_30 = p1->aCoord[local_24];
      }
      else {
        local_30 = p2->aCoord[local_24];
      }
      p1->aCoord[local_24] = local_30;
      if (p2->aCoord[local_24 + 1].i < p1->aCoord[local_24 + 1].i) {
        local_34 = p1->aCoord[local_24 + 1];
      }
      else {
        local_34 = p2->aCoord[local_24 + 1];
      }
      p1->aCoord[local_24 + 1] = local_34;
      local_24 = local_24 + 2;
    } while (local_24 < (int)(uint)pRtree->nDim2);
  }
  return;
}

Assistant:

static void cellUnion(Rtree *pRtree, RtreeCell *p1, RtreeCell *p2){
  int ii = 0;
  if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
    do{
      p1->aCoord[ii].f = MIN(p1->aCoord[ii].f, p2->aCoord[ii].f);
      p1->aCoord[ii+1].f = MAX(p1->aCoord[ii+1].f, p2->aCoord[ii+1].f);
      ii += 2;
    }while( ii<pRtree->nDim2 );
  }else{
    do{
      p1->aCoord[ii].i = MIN(p1->aCoord[ii].i, p2->aCoord[ii].i);
      p1->aCoord[ii+1].i = MAX(p1->aCoord[ii+1].i, p2->aCoord[ii+1].i);
      ii += 2;
    }while( ii<pRtree->nDim2 );
  }
}